

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O0

void device_reset_gameboy_sound(void *chip)

{
  UINT32 MuteMask;
  UINT32 muteMask;
  gb_sound_t *gb;
  void *chip_local;
  
  MuteMask = gameboy_sound_get_mute_mask(chip);
  RC_RESET((RATIO_CNTR *)((long)chip + 0x120));
  *(undefined8 *)((long)chip + 0x2c) = 0;
  *(undefined8 *)((long)chip + 0x34) = 0;
  *(undefined8 *)((long)chip + 0x1c) = 0;
  *(undefined8 *)((long)chip + 0x24) = 0;
  *(undefined8 *)((long)chip + 0xc) = 0;
  *(undefined8 *)((long)chip + 0x14) = 0;
  *(undefined4 *)((long)chip + 0x3c) = 0;
  *(undefined8 *)((long)chip + 0x60) = 0;
  *(undefined8 *)((long)chip + 0x68) = 0;
  *(undefined8 *)((long)chip + 0x50) = 0;
  *(undefined8 *)((long)chip + 0x58) = 0;
  *(undefined8 *)((long)chip + 0x40) = 0;
  *(undefined8 *)((long)chip + 0x48) = 0;
  *(undefined4 *)((long)chip + 0x70) = 0;
  *(undefined8 *)((long)chip + 0x94) = 0;
  *(undefined8 *)((long)chip + 0x9c) = 0;
  *(undefined8 *)((long)chip + 0x84) = 0;
  *(undefined8 *)((long)chip + 0x8c) = 0;
  *(undefined8 *)((long)chip + 0x74) = 0;
  *(undefined8 *)((long)chip + 0x7c) = 0;
  *(undefined4 *)((long)chip + 0xa4) = 0;
  *(undefined8 *)((long)chip + 200) = 0;
  *(undefined8 *)((long)chip + 0xd0) = 0;
  *(undefined8 *)((long)chip + 0xb8) = 0;
  *(undefined8 *)((long)chip + 0xc0) = 0;
  *(undefined8 *)((long)chip + 0xa8) = 0;
  *(undefined8 *)((long)chip + 0xb0) = 0;
  *(undefined4 *)((long)chip + 0xd8) = 0;
  gameboy_sound_set_mute_mask(chip,MuteMask);
  *(undefined1 *)((long)chip + 0x12) = 1;
  *(undefined1 *)((long)chip + 0x14) = 0x3f;
  *(undefined1 *)((long)chip + 0x46) = 2;
  *(undefined1 *)((long)chip + 0x48) = 0x3f;
  *(undefined1 *)((long)chip + 0x7a) = 3;
  *(undefined1 *)((long)chip + 0x7c) = 0xff;
  *(undefined1 *)((long)chip + 0xae) = 4;
  *(undefined1 *)((long)chip + 0xb0) = 0x3f;
  gb_sound_w_internal((gb_sound_t *)chip,'\x16','\0');
  if (*(char *)((long)chip + 0x130) == '\0') {
    *(undefined1 *)((long)chip + 0x110) = 0xac;
    *(undefined1 *)((long)chip + 0x111) = 0xdd;
    *(undefined1 *)((long)chip + 0x112) = 0xda;
    *(undefined1 *)((long)chip + 0x113) = 0x48;
    *(undefined1 *)((long)chip + 0x114) = 0x36;
    *(undefined1 *)((long)chip + 0x115) = 2;
    *(undefined1 *)((long)chip + 0x116) = 0xcf;
    *(undefined1 *)((long)chip + 0x117) = 0x16;
    *(undefined1 *)((long)chip + 0x118) = 0x2c;
    *(undefined1 *)((long)chip + 0x119) = 4;
    *(undefined1 *)((long)chip + 0x11a) = 0xe5;
    *(undefined1 *)((long)chip + 0x11b) = 0x2c;
    *(undefined1 *)((long)chip + 0x11c) = 0xac;
    *(undefined1 *)((long)chip + 0x11d) = 0xdd;
    *(undefined1 *)((long)chip + 0x11e) = 0xda;
    *(undefined1 *)((long)chip + 0x11f) = 0x48;
  }
  else if (*(char *)((long)chip + 0x130) == '\x01') {
    *(undefined1 *)((long)chip + 0x110) = 0;
    *(undefined1 *)((long)chip + 0x111) = 0xff;
    *(undefined1 *)((long)chip + 0x112) = 0;
    *(undefined1 *)((long)chip + 0x113) = 0xff;
    *(undefined1 *)((long)chip + 0x114) = 0;
    *(undefined1 *)((long)chip + 0x115) = 0xff;
    *(undefined1 *)((long)chip + 0x116) = 0;
    *(undefined1 *)((long)chip + 0x117) = 0xff;
    *(undefined1 *)((long)chip + 0x118) = 0;
    *(undefined1 *)((long)chip + 0x119) = 0xff;
    *(undefined1 *)((long)chip + 0x11a) = 0;
    *(undefined1 *)((long)chip + 0x11b) = 0xff;
    *(undefined1 *)((long)chip + 0x11c) = 0;
    *(undefined1 *)((long)chip + 0x11d) = 0xff;
    *(undefined1 *)((long)chip + 0x11e) = 0;
    *(undefined1 *)((long)chip + 0x11f) = 0xff;
  }
  return;
}

Assistant:

static void device_reset_gameboy_sound(void *chip)
{
	gb_sound_t *gb = (gb_sound_t *)chip;
	UINT32 muteMask;

	muteMask = gameboy_sound_get_mute_mask(gb);

	RC_RESET(&gb->cycleCntr);

	memset(&gb->snd_1, 0, sizeof(gb->snd_1));
	memset(&gb->snd_2, 0, sizeof(gb->snd_2));
	memset(&gb->snd_3, 0, sizeof(gb->snd_3));
	memset(&gb->snd_4, 0, sizeof(gb->snd_4));

	gameboy_sound_set_mute_mask(gb, muteMask);

	gb->snd_1.channel = 1;
	gb->snd_1.length_mask = 0x3F;
	gb->snd_2.channel = 2;
	gb->snd_2.length_mask = 0x3F;
	gb->snd_3.channel = 3;
	gb->snd_3.length_mask = 0xFF;
	gb->snd_4.channel = 4;
	gb->snd_4.length_mask = 0x3F;

	gb_sound_w_internal(gb, NR52, 0x00);
	switch(gb->gbMode)
	{
	case GBMODE_DMG:
		gb->snd_regs[AUD3W0] = 0xac;
		gb->snd_regs[AUD3W1] = 0xdd;
		gb->snd_regs[AUD3W2] = 0xda;
		gb->snd_regs[AUD3W3] = 0x48;
		gb->snd_regs[AUD3W4] = 0x36;
		gb->snd_regs[AUD3W5] = 0x02;
		gb->snd_regs[AUD3W6] = 0xcf;
		gb->snd_regs[AUD3W7] = 0x16;
		gb->snd_regs[AUD3W8] = 0x2c;
		gb->snd_regs[AUD3W9] = 0x04;
		gb->snd_regs[AUD3WA] = 0xe5;
		gb->snd_regs[AUD3WB] = 0x2c;
		gb->snd_regs[AUD3WC] = 0xac;
		gb->snd_regs[AUD3WD] = 0xdd;
		gb->snd_regs[AUD3WE] = 0xda;
		gb->snd_regs[AUD3WF] = 0x48;
		break;
	case GBMODE_CGB04:
		gb->snd_regs[AUD3W0] = 0x00;
		gb->snd_regs[AUD3W1] = 0xFF;
		gb->snd_regs[AUD3W2] = 0x00;
		gb->snd_regs[AUD3W3] = 0xFF;
		gb->snd_regs[AUD3W4] = 0x00;
		gb->snd_regs[AUD3W5] = 0xFF;
		gb->snd_regs[AUD3W6] = 0x00;
		gb->snd_regs[AUD3W7] = 0xFF;
		gb->snd_regs[AUD3W8] = 0x00;
		gb->snd_regs[AUD3W9] = 0xFF;
		gb->snd_regs[AUD3WA] = 0x00;
		gb->snd_regs[AUD3WB] = 0xFF;
		gb->snd_regs[AUD3WC] = 0x00;
		gb->snd_regs[AUD3WD] = 0xFF;
		gb->snd_regs[AUD3WE] = 0x00;
		gb->snd_regs[AUD3WF] = 0xFF;
		break;
	}

	return;
}